

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void * hash_table_get_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  hash_table_bucket_t *phVar2;
  int iVar3;
  size_t sVar4;
  
  sVar1 = (table->ghash).mult;
  sVar4 = (*table->hash)(key);
  phVar2 = table->buckets
           [sVar4 * sVar1 + (table->ghash).add >> (-(char)(table->ghash).log2_buckets & 0x3fU) &
            0xffffffff].next;
  while( true ) {
    if (phVar2 == (hash_table_bucket_t *)0x0) {
      return (void *)0x0;
    }
    iVar3 = (*table->is_equal)(key,phVar2->data);
    if (iVar3 != 0) break;
    phVar2 = phVar2->next;
  }
  return phVar2->data;
}

Assistant:

void * hash_table_get_item( const hash_table_t * table, void * key )
{
    unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
    const hash_table_bucket_t *b = table->buckets[i].next;

    while (b) {
        if ( (*table->is_equal)(key, b->data) )
            return b->data;
        b = b->next;
    }

    return NULL;
}